

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

pair<const_char_*,_bool> __thiscall
google::protobuf::internal::EpsCopyInputStream::DoneFallback
          (EpsCopyInputStream *this,int overrun,int depth)

{
  LogMessage *pLVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  undefined8 unaff_R13;
  ulong uVar5;
  undefined7 uVar6;
  pair<const_char_*,_bool> pVar7;
  LogFinisher local_1b9;
  LogMessage local_1b8;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  uVar5 = CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
  if (this->limit_ < overrun) {
    pcVar2 = (char *)0x0;
  }
  else {
    if (this->limit_ == overrun) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                 ,0xaf);
      pLVar1 = LogMessage::operator<<(&local_68,"CHECK failed: overrun != limit_: ");
      LogFinisher::operator=((LogFinisher *)&local_d8,pLVar1);
      LogMessage::~LogMessage(&local_68);
    }
    if (this->limit_ <= overrun) {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                 ,0xb0);
      pLVar1 = LogMessage::operator<<(&local_d8,"CHECK failed: overrun < limit_: ");
      LogFinisher::operator=((LogFinisher *)&local_110,pLVar1);
      LogMessage::~LogMessage(&local_d8);
    }
    if (this->limit_end_ != this->buffer_end_ + (this->limit_ >> 0x1f & this->limit_)) {
      LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                 ,0xb5);
      pLVar1 = LogMessage::operator<<
                         (&local_110,
                          "CHECK failed: limit_end_ == buffer_end_ + (std::min)(0, limit_): ");
      LogFinisher::operator=((LogFinisher *)&local_148,pLVar1);
      LogMessage::~LogMessage(&local_110);
    }
    if (this->limit_ < 1) {
      LogMessage::LogMessage
                (&local_148,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                 ,0xb7);
      pLVar1 = LogMessage::operator<<(&local_148,"CHECK failed: limit_ > 0: ");
      LogFinisher::operator=((LogFinisher *)&local_180,pLVar1);
      LogMessage::~LogMessage(&local_148);
    }
    if (this->limit_end_ != this->buffer_end_) {
      LogMessage::LogMessage
                (&local_180,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                 ,0xb8);
      pLVar1 = LogMessage::operator<<(&local_180,"CHECK failed: limit_end_ == buffer_end_: ");
      LogFinisher::operator=((LogFinisher *)&local_a0,pLVar1);
      LogMessage::~LogMessage(&local_180);
    }
    do {
      if (overrun < 0) {
        LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                   ,0xbc);
        pLVar1 = LogMessage::operator<<(&local_a0,"CHECK failed: overrun >= 0: ");
        LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar1);
        LogMessage::~LogMessage(&local_a0);
      }
      pcVar2 = NextBuffer(this,overrun,depth);
      if (pcVar2 == (char *)0x0) {
        uVar6 = (undefined7)((ulong)&local_a0 >> 8);
        if (overrun == 0) {
          uVar5 = CONCAT71(uVar6,1);
          if (this->limit_ < 1) {
            LogMessage::LogMessage
                      (&local_1b8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                       ,0xc1);
            pLVar1 = LogMessage::operator<<(&local_1b8,"CHECK failed: limit_ > 0: ");
            LogFinisher::operator=(&local_1b9,pLVar1);
            LogMessage::~LogMessage(&local_1b8);
          }
          pcVar2 = this->buffer_end_;
          this->limit_end_ = pcVar2;
          this->last_tag_minus_1_ = 1;
        }
        else {
          pcVar2 = (char *)0x0;
          uVar5 = CONCAT71(uVar6,1);
        }
        goto LAB_0038a590;
      }
      iVar3 = (int)this->buffer_end_;
      uVar4 = ((int)pcVar2 - iVar3) + this->limit_;
      this->limit_ = uVar4;
      pcVar2 = pcVar2 + overrun;
      overrun = (int)pcVar2 - iVar3;
    } while (-1 < overrun);
    this->limit_end_ = this->buffer_end_ + (int)((int)uVar4 >> 0x1f & uVar4);
    uVar5 = 0;
  }
LAB_0038a590:
  pVar7._8_8_ = uVar5 & 0xffffffff;
  pVar7.first = pcVar2;
  return pVar7;
}

Assistant:

std::pair<const char*, bool> EpsCopyInputStream::DoneFallback(int overrun,
                                                              int depth) {
  // Did we exceeded the limit (parse error).
  if (PROTOBUF_PREDICT_FALSE(overrun > limit_)) return {nullptr, true};
  GOOGLE_DCHECK(overrun != limit_);  // Guaranteed by caller.
  GOOGLE_DCHECK(overrun < limit_);   // Follows from above
  // TODO(gerbens) Instead of this dcheck we could just assign, and remove
  // updating the limit_end from PopLimit, ie.
  // limit_end_ = buffer_end_ + (std::min)(0, limit_);
  // if (ptr < limit_end_) return {ptr, false};
  GOOGLE_DCHECK(limit_end_ == buffer_end_ + (std::min)(0, limit_));
  // At this point we know the following assertion holds.
  GOOGLE_DCHECK(limit_ > 0);
  GOOGLE_DCHECK(limit_end_ == buffer_end_);  // because limit_ > 0
  const char* p;
  do {
    // We are past the end of buffer_end_, in the slop region.
    GOOGLE_DCHECK(overrun >= 0);
    p = NextBuffer(overrun, depth);
    if (p == nullptr) {
      // We are at the end of the stream
      if (PROTOBUF_PREDICT_FALSE(overrun != 0)) return {nullptr, true};
      GOOGLE_DCHECK(limit_ > 0);
      limit_end_ = buffer_end_;
      // Distinguish ending on a pushed limit or ending on end-of-stream.
      SetEndOfStream();
      return {buffer_end_, true};
    }
    limit_ -= buffer_end_ - p;  // Adjust limit_ relative to new anchor
    p += overrun;
    overrun = p - buffer_end_;
  } while (overrun >= 0);
  limit_end_ = buffer_end_ + std::min(0, limit_);
  return {p, false};
}